

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt.hpp
# Opt level: O1

void tl::printError<char_const*>(char **args)

{
  tl *this;
  u32 uVar1;
  u32 uVar2;
  char *pcVar3;
  CStr str_00;
  CStr str_01;
  CStr str_02;
  CStr str_03;
  CStr str_04;
  Str str;
  CStrT<char> local_68;
  uint local_58;
  CStrT<char> local_50;
  StrT<char> local_40;
  
  this = _stderr;
  CStrT<char>::CStrT(&local_68,*args);
  str_00._0_8_ = local_68._0_8_ & 0xffffffff;
  str_00._str = local_68._str;
  uVar1 = calcToStringLengthT(str_00);
  CStrT<char>::CStrT(&local_68,"\n");
  str_01._0_8_ = local_68._0_8_ & 0xffffffff;
  str_01._str = local_68._str;
  uVar2 = calcToStringLengthT(str_01);
  StrT<char>::StrT(&local_40,uVar1 + uVar2,'.');
  local_58 = uVar1 + uVar2 + 1;
  pcVar3 = (char *)(ulong)local_58;
  local_68._0_8_ = local_40._str;
  local_68._str = local_40._str;
  CStrT<char>::CStrT(&local_50,*args);
  str_02._str = pcVar3;
  str_02._0_8_ = local_50._str;
  toStringBufferT((tl *)&local_68,(FmtBuffer *)(ulong)local_50._size,str_02);
  CStrT<char>::CStrT(&local_50,"\n");
  str_03._str = pcVar3;
  str_03._0_8_ = local_50._str;
  toStringBufferT((tl *)&local_68,(FmtBuffer *)(ulong)local_50._size,str_03);
  if (local_58 == 0) {
    local_68._str[-1] = '\0';
  }
  else {
    *local_68._str = '\0';
    local_68._str = local_68._str + 1;
    local_58 = local_58 - 1;
  }
  CStrT<char>::CStrT(&local_68,&local_40);
  str_04._str = pcVar3;
  str_04._0_8_ = local_68._str;
  fprintCStr(this,(FILE *)(local_68._0_8_ & 0xffffffff),str_04);
  StrT<char>::~StrT(&local_40);
  return;
}

Assistant:

static void printError(const Args&... args)
{
    fprint(stderr, args..., "\n");
}